

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O2

void __thiscall SPSUnit::SPSUnit(SPSUnit *this)

{
  allocator_type local_21;
  
  (this->super_NALUnit).bitReader.super_BitStream.m_totalBits = 0;
  (this->super_NALUnit).bitReader.m_curVal = 0;
  (this->super_NALUnit).bitReader.m_bitLeft = 0;
  (this->super_NALUnit).bitReader.super_BitStream.m_buffer = (uint *)0x0;
  (this->super_NALUnit).bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
  (this->super_NALUnit).m_nalBufferLen = 0;
  (this->super_NALUnit).nal_unit_type = nuUnspecified;
  (this->super_NALUnit).nal_ref_idc = 0;
  (this->super_NALUnit).m_nalBuffer = (uint8_t *)0x0;
  (this->super_NALUnit)._vptr_NALUnit = (_func_int **)&PTR__SPSUnit_0024c018;
  this->m_ready = false;
  this->sar_width = 0;
  this->sar_height = 0;
  this->num_units_in_tick = 0;
  this->time_scale = 0;
  this->fixed_frame_rate_flag = 0;
  this->num_units_in_tick_bit_pos = 0;
  this->pic_struct_present_flag = 0;
  this->frame_crop_left_offset = 0;
  this->frame_crop_right_offset = 0;
  this->frame_crop_top_offset = 0;
  this->frame_crop_bottom_offset = 0;
  this->full_sps_bit_len = 0;
  this->vui_parameters_bit_pos = -1;
  this->low_delay_hrd_flag = 0;
  this->separate_colour_plane_flag = 0;
  this->profile_idc = 0;
  this->num_views = 0;
  this->level_idc = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->level_idc_ext,0,&local_21);
  this->seq_parameter_set_id = 0;
  this->chroma_format_idc = 1;
  this->log2_max_frame_num = 0;
  this->pic_order_cnt_type = 0;
  this->log2_max_pic_order_cnt_lsb = 0;
  this->delta_pic_order_always_zero_flag = 0;
  this->offset_for_non_ref_pic = 0;
  this->num_ref_frames = 0;
  this->pic_width_in_mbs = 0;
  this->pic_height_in_map_units = 0;
  this->frame_mbs_only_flag = 0;
  this->vui_parameters_present_flag = 0;
  this->timing_info_present_flag = 0;
  this->aspect_ratio_info_present_flag = 0;
  this->aspect_ratio_idc = '\0';
  this->hrdParamsBitPos = -1;
  HRDParams::HRDParams(&this->nalHrdParams);
  HRDParams::HRDParams(&this->vclHrdParams);
  (this->view_id).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->view_id).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mvcVclHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->view_id).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mvcVclHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mvcVclHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mvcNalHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mvcNalHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mvcHrdParamsBitPos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mvcNalHrdParams).super__Vector_base<HRDParams,_std::allocator<HRDParams>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mvcHrdParamsBitPos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mvcHrdParamsBitPos).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

SPSUnit::SPSUnit()
    : m_ready(false),
      sar_width(0),
      sar_height(0),
      num_units_in_tick(0),
      time_scale(0),
      fixed_frame_rate_flag(0),
      num_units_in_tick_bit_pos(0),
      pic_struct_present_flag(0),
      frame_crop_left_offset(0),
      frame_crop_right_offset(0),
      frame_crop_top_offset(0),
      frame_crop_bottom_offset(0),
      full_sps_bit_len(0),
      vui_parameters_bit_pos(-1),
      low_delay_hrd_flag(0),
      separate_colour_plane_flag(0),
      profile_idc(0),
      num_views(0),
      level_idc(0),
      level_idc_ext(0),
      seq_parameter_set_id(0),
      chroma_format_idc(1),
      log2_max_frame_num(0),
      pic_order_cnt_type(0),
      log2_max_pic_order_cnt_lsb(0),
      delta_pic_order_always_zero_flag(0),
      offset_for_non_ref_pic(0),
      num_ref_frames(0),
      pic_width_in_mbs(0),
      pic_height_in_map_units(0),
      frame_mbs_only_flag(0),
      vui_parameters_present_flag(0),
      timing_info_present_flag(0),
      aspect_ratio_info_present_flag(0),
      aspect_ratio_idc(0),
      hrdParamsBitPos(-1)
{
}